

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.cc
# Opt level: O2

void __thiscall OpenMesh::BaseKernel::eprop_stats(BaseKernel *this,ostream *_ostr)

{
  BaseProperty *pBVar1;
  ostream *poVar2;
  pointer ppBVar3;
  
  for (ppBVar3 = (this->eprops_).properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppBVar3 !=
      (this->eprops_).properties_.
      super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppBVar3 = ppBVar3 + 1) {
    pBVar1 = *ppBVar3;
    if (pBVar1 == (BaseProperty *)0x0) {
      poVar2 = std::operator<<(_ostr,"[deleted]");
      std::operator<<(poVar2,"\n");
    }
    else {
      (*pBVar1->_vptr_BaseProperty[9])(pBVar1,_ostr);
    }
  }
  return;
}

Assistant:

void BaseKernel::eprop_stats(std::ostream& _ostr ) const
{
  PropertyContainer::Properties::const_iterator it;
  const PropertyContainer::Properties& eps = eprops_.properties();
  for (it=eps.begin(); it!=eps.end(); ++it)
    *it == NULL ? (void)(_ostr << "[deleted]" << "\n") : (*it)->stats(_ostr);

}